

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::FormulasLoader::~FormulasLoader(FormulasLoader *this)

{
  HelperLoaderBase *in_RDI;
  
  in_RDI->_vptr_HelperLoaderBase = (_func_int **)&PTR__FormulasLoader_00dbea70;
  std::__cxx11::string::~string((string *)&in_RDI[0x12].mHandlingFilePartLoader);
  COLLADAFW::UniqueId::~UniqueId((UniqueId *)(in_RDI + 0x10));
  std::__cxx11::string::~string((string *)&in_RDI[0xd].mHandlingFilePartLoader);
  std::__cxx11::string::~string((string *)&in_RDI[0xb].mHandlingFilePartLoader);
  std::
  stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
  ::~stack((stack<COLLADASaxFWL::Operator,_std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>_>
            *)0xb25eae);
  std::
  stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
  ::~stack((stack<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>_>
            *)0xb25ebc);
  HelperLoaderBase::~HelperLoaderBase(in_RDI);
  return;
}

Assistant:

FormulasLoader::~FormulasLoader()
	{
	}